

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.h
# Opt level: O2

double __thiscall google::protobuf::MapValueConstRef::GetDoubleValue(MapValueConstRef *this)

{
  CppType CVar1;
  LogMessage *pLVar2;
  string_view sVar3;
  LogMessage local_20;
  
  CVar1 = type(this);
  if (CVar1 == CPPTYPE_DOUBLE) {
    return *this->data_;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_20,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_field.h"
             ,0x2a6);
  pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<
                     (&local_20,(char (*) [34])"Protocol Buffer map usage error:\n");
  pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<
                     (pLVar2,(char (*) [33])"MapValueConstRef::GetDoubleValue");
  pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<
                     (pLVar2,(char (*) [22])" type does not match\n");
  pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<
                     (pLVar2,(char (*) [14])"  Expected : ");
  sVar3 = FieldDescriptor::CppTypeName(CPPTYPE_DOUBLE);
  pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar2,sVar3);
  pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar2,(char (*) [2])0x365afb);
  pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<
                     (pLVar2,(char (*) [14])"  Actual   : ");
  CVar1 = type(this);
  sVar3 = FieldDescriptor::CppTypeName(CVar1);
  absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar2,sVar3);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_20);
}

Assistant:

double GetDoubleValue() const {
    TYPE_CHECK(FieldDescriptor::CPPTYPE_DOUBLE,
               "MapValueConstRef::GetDoubleValue");
    return *reinterpret_cast<double*>(data_);
  }